

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O1

void __thiscall FSChaCha20Poly1305::NextPacket(FSChaCha20Poly1305 *this)

{
  uint32_t uVar1;
  long in_FS_OFFSET;
  Nonce96 nonce;
  Span<std::byte> out;
  Span<const_std::byte> key;
  byte one_block [64];
  byte abStack_58 [64];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->m_packet_counter + 1;
  this->m_packet_counter = uVar1;
  if (uVar1 == this->m_rekey_interval) {
    nonce.second = this->m_rekey_counter;
    nonce._0_8_ = 0xffffffff;
    ChaCha20Aligned::Seek((ChaCha20Aligned *)this,nonce,1);
    (this->m_aead).m_chacha20.m_bufleft = 0;
    out.m_size = 0x40;
    out.m_data = abStack_58;
    ChaCha20::Keystream((ChaCha20 *)this,out);
    key.m_size = 0x20;
    key.m_data = abStack_58;
    AEADChaCha20Poly1305::SetKey(&this->m_aead,key);
    memory_cleanse(abStack_58,0x40);
    this->m_packet_counter = 0;
    this->m_rekey_counter = this->m_rekey_counter + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FSChaCha20Poly1305::NextPacket() noexcept
{
    if (++m_packet_counter == m_rekey_interval) {
        // Generate a full block of keystream, to avoid needing the ChaCha20 buffer, even though
        // we only need KEYLEN (32) bytes.
        std::byte one_block[ChaCha20Aligned::BLOCKLEN];
        m_aead.Keystream({0xFFFFFFFF, m_rekey_counter}, one_block);
        // Switch keys.
        m_aead.SetKey(Span{one_block}.first(KEYLEN));
        // Wipe the generated keystream (a copy remains inside m_aead, which will be cleaned up
        // once it cycles again, or is destroyed).
        memory_cleanse(one_block, sizeof(one_block));
        // Update counters.
        m_packet_counter = 0;
        ++m_rekey_counter;
    }
}